

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

void __thiscall ColorTest_red_Test::~ColorTest_red_Test(ColorTest_red_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ColorTest, red) {
	color color_value{ 0xFF0000 };
	color color_rgb{ 0xFF, 0, 0 };

	EXPECT_EQ(color_value, color_rgb);
	EXPECT_EQ(color_value.value(), 0xFF0000U);
	EXPECT_EQ(color_value.red(), 0xFF);
	EXPECT_EQ(color_value.green(), 0x00);
	EXPECT_EQ(color_value.blue(), 0x00);
}